

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::srgb_decode_texparameterIuiv
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  RenderContext *pRVar3;
  NotSupportedError *pNVar4;
  allocator<char> local_81;
  string local_80;
  GLuint local_5c;
  GLuint GStack_58;
  GLuint texture;
  GLuint textureMode [2];
  string local_48;
  deUint32 local_18;
  ContextType local_14;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_14,(ApiType)local_18);
  pNVar1 = local_10;
  if (!bVar2) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"glTexParameterIuiv is not supported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
               ,0xfb2);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GL_EXT_texture_sRGB_decode",
             (allocator<char> *)((long)textureMode + 7));
  bVar2 = NegativeTestContext::isExtensionSupported(pNVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)textureMode + 7));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    _GStack_58 = 0x190100001902;
    local_5c = 0x1234;
    glu::CallLogWrapper::glGenTextures(&local_10->super_CallLogWrapper,1,&local_5c);
    glu::CallLogWrapper::glBindTexture(&local_10->super_CallLogWrapper,0xde1,local_5c);
    pNVar1 = local_10;
    _GStack_58 = 0x110000001100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT)."
               ,&local_81);
    NegativeTestContext::beginSection(pNVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    glu::CallLogWrapper::glTexParameterIuiv(&local_10->super_CallLogWrapper,0xde1,0x8a48,&GStack_58)
    ;
    NegativeTestContext::expectError(local_10,0x500);
    NegativeTestContext::endSection(local_10);
    glu::CallLogWrapper::glDeleteTextures(&local_10->super_CallLogWrapper,1,&local_5c);
    return;
  }
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar4,"GL_EXT_texture_sRGB_decode is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
             ,0xfb5);
  __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void srgb_decode_texparameterIuiv (NegativeTestContext& ctx)
{
	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError,"glTexParameterIuiv is not supported.");

	if (!ctx.isExtensionSupported("GL_EXT_texture_sRGB_decode"))
		TCU_THROW(NotSupportedError, "GL_EXT_texture_sRGB_decode is not supported.");

	GLuint	textureMode[]	= {GL_DEPTH_COMPONENT, GL_STENCIL_INDEX};
	GLuint	texture			= 0x1234;

	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	textureMode[0] = GL_DONT_CARE;
	textureMode[1] = GL_DONT_CARE;
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT).");
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_SRGB_DECODE_EXT, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}